

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O0

int __thiscall
ncnn::Crop::forward(Crop *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int *piVar1;
  ulong uVar2;
  long in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  Crop *in_RDI;
  bool bVar3;
  Mat borderm_1;
  Mat m_5;
  int z;
  int q_1;
  Mat bottom_blob_sliced_1;
  Mat borderm;
  Mat m_1;
  int q;
  Mat bottom_blob_sliced;
  int _outc;
  int _outd;
  int _outh;
  int _outw;
  int _coffset;
  int _doffset;
  int _hoffset;
  int _woffset;
  Mat *top_blob;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *reference_blob;
  Mat *bottom_blob;
  Mat *m_4;
  Mat *m;
  Mat *m_6;
  Mat *m_2;
  Mat *m_7;
  Mat *m_3;
  Allocator *_allocator;
  Allocator *_allocator_00;
  int *in_stack_ffffffffffffed68;
  undefined4 in_stack_ffffffffffffed70;
  int in_stack_ffffffffffffed74;
  Mat *in_stack_ffffffffffffed78;
  void **ppvVar4;
  Mat *in_stack_ffffffffffffed80;
  Allocator *in_stack_ffffffffffffedd0;
  int *in_stack_ffffffffffffeef0;
  undefined7 in_stack_ffffffffffffeef8;
  undefined1 in_stack_ffffffffffffeeff;
  int *in_stack_ffffffffffffef00;
  undefined7 in_stack_ffffffffffffef08;
  undefined1 in_stack_ffffffffffffef0f;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_ffffffffffffef10;
  Mat *pMVar5;
  Crop *in_stack_ffffffffffffef18;
  const_reference pvVar6;
  int *in_stack_ffffffffffffef30;
  int *in_stack_ffffffffffffef38;
  int *in_stack_ffffffffffffef40;
  int *in_stack_ffffffffffffef48;
  const_reference pvVar7;
  undefined8 local_fa0;
  undefined8 local_f98;
  undefined8 local_f90;
  undefined4 local_f88;
  Allocator *local_f80;
  undefined4 local_f78;
  undefined4 local_f74;
  undefined4 local_f70;
  undefined4 local_f6c;
  undefined4 local_f68;
  undefined8 local_f60;
  void *local_f58;
  int *local_f50;
  size_t local_f48;
  int local_f40;
  Allocator *local_f38;
  undefined4 local_f30;
  int local_f2c;
  int local_f28;
  undefined4 local_f24;
  undefined4 local_f20;
  long local_f18;
  undefined8 local_f10;
  undefined8 local_f08;
  undefined8 local_f00;
  undefined4 local_ef8;
  Allocator *local_ef0;
  undefined4 local_ee8;
  undefined4 local_ee4;
  undefined4 local_ee0;
  undefined4 local_edc;
  undefined4 local_ed8;
  undefined8 local_ed0;
  void *local_ec8;
  int *local_ec0;
  ulong local_eb8;
  int local_eb0;
  Allocator *local_ea8;
  undefined4 local_ea0;
  int local_e9c;
  int local_e98;
  undefined4 local_e94;
  undefined4 local_e90;
  long local_e88;
  int local_e80;
  int local_e7c;
  Mat local_e78;
  void *local_e30;
  int *local_e28;
  ulong local_e20;
  int local_e18;
  Allocator *local_e10;
  int local_e08;
  int local_e04;
  int local_e00;
  uint local_dfc;
  int local_df8;
  ulong local_df0;
  void *local_de8;
  int *local_de0;
  ulong local_dd8;
  int local_dd0;
  Allocator *local_dc8;
  int local_dc0;
  int local_dbc;
  int local_db8;
  undefined4 local_db4;
  int local_db0;
  ulong local_da8;
  void *local_da0;
  int *local_d98;
  ulong local_d90;
  int local_d88;
  Allocator *local_d80;
  int local_d78;
  int local_d74;
  int local_d70;
  undefined4 local_d6c;
  uint local_d68;
  ulong local_d60;
  int local_d58;
  int local_d54;
  Mat local_d50;
  void *local_d08;
  int *local_d00;
  ulong local_cf8;
  int local_cf0;
  Allocator *local_ce8;
  int local_ce0;
  int local_cdc;
  int local_cd8;
  uint local_cd4;
  int local_cd0;
  ulong local_cc8;
  Mat local_cc0;
  Mat local_c78;
  Mat local_c20;
  undefined1 local_bd8 [8];
  Allocator local_bd0;
  int local_bc8;
  int local_bc4;
  int local_bc0;
  int local_bbc;
  const_reference local_bb8;
  size_t local_bb0;
  int local_ba4;
  int local_ba0;
  int local_b9c;
  int local_b98;
  int local_b94;
  const_reference local_b90;
  const_reference local_b88;
  long local_b80;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_b78;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_b70;
  int local_b5c;
  Mat *local_b58;
  Mat *local_b48;
  Mat *local_b38;
  Mat *local_b28;
  void **local_b18;
  void **local_b08;
  void **local_af8;
  Mat *local_ae8;
  undefined8 *local_ad8;
  undefined8 *local_ac8;
  void **local_ab8;
  void **local_aa8;
  void **local_a98;
  int local_a88;
  undefined4 local_a84;
  const_reference local_a80;
  const_reference local_a78;
  const_reference local_a70;
  int local_a68;
  undefined4 local_a64;
  const_reference local_a60;
  const_reference local_a58;
  int local_a48;
  undefined4 local_a44;
  const_reference local_a40;
  const_reference local_a38;
  const_reference local_a30;
  int local_a28;
  undefined4 local_a24;
  const_reference local_a20;
  const_reference local_a18;
  int local_a08;
  undefined4 local_a04;
  const_reference local_a00;
  const_reference local_9f8;
  int local_9e8;
  undefined4 local_9e4;
  const_reference local_9e0;
  const_reference local_9d8;
  const_reference local_9c8;
  const_reference local_9c0;
  const_reference local_9b8;
  const_reference local_9b0;
  const_reference local_9a8;
  const_reference local_9a0;
  const_reference local_998;
  Mat *local_990;
  Mat *local_988;
  const_reference local_980;
  Mat *local_978;
  Mat *local_970;
  const_reference local_968;
  Mat *local_960;
  Mat *local_958;
  undefined1 local_949;
  int local_944;
  const_reference local_940;
  void **local_938;
  undefined1 local_921;
  int local_91c;
  const_reference local_918;
  void **local_910;
  undefined1 local_8fd;
  int local_8fc;
  void **local_8f8;
  undefined8 *local_8f0;
  undefined1 local_8dd;
  int local_8dc;
  void **local_8d8;
  void **local_8d0;
  undefined1 local_8bd;
  int local_8bc;
  const_reference local_8b8;
  undefined8 *local_8b0;
  undefined1 local_89d;
  int local_89c;
  const_reference local_898;
  void **local_890;
  int local_87c;
  undefined8 *local_878;
  void **local_870;
  int local_864;
  undefined8 *local_860;
  void **local_858;
  const_reference local_850;
  int local_7e8;
  undefined4 local_7e4;
  const_reference local_7e0;
  int local_7d8;
  undefined4 local_7d4;
  const_reference local_7d0;
  int local_7c8;
  undefined4 local_7c4;
  const_reference local_7c0;
  int local_7b8;
  undefined4 local_7b4;
  const_reference local_7b0;
  int local_7a8;
  undefined4 local_7a4;
  const_reference local_7a0;
  int local_798;
  undefined4 local_794;
  const_reference local_790;
  int local_778;
  undefined4 local_774;
  void **local_770;
  int local_758;
  undefined4 local_754;
  void **local_750;
  int local_738;
  undefined4 local_734;
  void **local_730;
  undefined8 *local_710;
  undefined8 *local_6f0;
  int local_6d8;
  undefined4 local_6d4;
  Mat *local_6d0;
  int local_6b8;
  undefined4 local_6b4;
  void **local_6b0;
  int local_698;
  undefined4 local_694;
  void **local_690;
  int local_678;
  undefined4 local_674;
  void **local_670;
  int local_658;
  undefined4 local_654;
  Mat *local_650;
  int local_638;
  undefined4 local_634;
  Mat *local_630;
  int local_618;
  undefined4 local_614;
  Mat *local_610;
  int local_5f8;
  undefined4 local_5f4;
  Mat *local_5f0;
  void *local_5e8;
  void *local_5d8;
  void *local_5c8;
  void *local_5a8;
  void *local_598;
  void *local_588;
  void *local_548;
  void *local_538;
  void *local_528;
  void *local_518;
  void *local_510;
  void *local_508;
  void *local_500;
  void *local_4f8;
  void *local_4f0;
  const_reference local_4b8;
  const_reference local_4b0;
  const_reference local_4a8;
  const_reference local_4a0;
  const_reference local_498;
  const_reference local_490;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 local_478;
  int local_46c;
  Mat *local_468;
  undefined8 local_460;
  undefined8 local_458;
  undefined8 local_450;
  int local_444;
  Mat *local_440;
  undefined8 local_438;
  undefined8 local_430;
  undefined8 local_428;
  int local_41c;
  Mat *local_418;
  undefined8 local_410;
  undefined8 local_408;
  undefined8 local_400;
  int local_3f8;
  int local_3f4;
  Mat *local_3f0;
  undefined8 local_3e8;
  undefined8 local_3e0;
  undefined8 local_3d8;
  int local_3d0;
  int local_3cc;
  Mat *local_3c8;
  undefined8 local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  int local_3a8;
  int local_3a4;
  Mat *local_3a0;
  undefined8 local_398;
  undefined8 local_390;
  undefined8 local_388;
  int local_37c;
  int local_378;
  int local_374;
  Mat *local_370;
  undefined8 local_368;
  undefined8 local_360;
  undefined8 local_358;
  int local_34c;
  int local_348;
  int local_344;
  Mat *local_340;
  undefined8 local_338;
  undefined8 local_330;
  undefined8 local_328;
  int local_31c;
  int local_318;
  int local_314;
  Mat *local_310;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  int local_2f0;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  Mat *local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  int local_2c0;
  int local_2bc;
  int local_2b8;
  int local_2b4;
  Mat *local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  int local_290;
  int local_28c;
  int local_288;
  int local_284;
  Mat *local_280;
  undefined4 local_274;
  long local_270;
  undefined4 local_264;
  long local_260;
  undefined4 local_254;
  long local_250;
  undefined4 local_244;
  long local_240;
  undefined4 local_234;
  long local_230;
  undefined4 local_224;
  long local_220;
  Allocator *local_218;
  int local_20c;
  ulong local_208;
  void *local_200;
  uint local_1f4;
  int local_1f0;
  int local_1ec;
  void **local_1e8;
  undefined4 local_1dc;
  long local_1d8;
  Allocator *local_1d0;
  int local_1c4;
  ulong local_1c0;
  void *local_1b8;
  uint local_1ac;
  int local_1a8;
  int local_1a4;
  void **local_1a0;
  undefined4 local_194;
  long local_190;
  Allocator *local_188;
  int local_17c;
  ulong local_178;
  void *local_170;
  int local_164;
  int local_160;
  int local_15c;
  void **local_158;
  undefined4 local_14c;
  long local_148;
  Allocator *local_140;
  int local_134;
  size_t local_130;
  void *local_128;
  int local_11c;
  int local_118;
  int local_114;
  undefined8 *local_110;
  undefined4 local_104;
  long local_100;
  Allocator *local_f8;
  int local_ec;
  ulong local_e8;
  void *local_e0;
  uint local_d4;
  int local_d0;
  int local_cc;
  void **local_c8;
  undefined4 local_bc;
  long local_b8;
  Allocator *local_b0;
  int local_a4;
  ulong local_a0;
  void *local_98;
  uint local_8c;
  int local_88;
  int local_84;
  undefined8 *local_80;
  undefined4 local_74;
  long local_70;
  Allocator *local_68;
  int local_5c;
  size_t local_58;
  void *local_50;
  int local_48;
  int local_44;
  void **local_40;
  Allocator *local_38;
  int local_2c;
  ulong local_28;
  void *local_20;
  int local_18;
  int local_14;
  void **local_10;
  
  local_b80 = in_RCX;
  local_b78 = in_RDX;
  local_b70 = in_RSI;
  local_b88 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_b90 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_b70,1);
  local_b94 = local_b88->w;
  local_b98 = local_b88->h;
  local_b9c = local_b88->d;
  local_ba0 = local_b88->c;
  local_ba4 = local_b88->dims;
  local_bb0 = local_b88->elemsize;
  local_bb8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_b78,0);
  local_bc8 = -1;
  local_bd0._vptr_Allocator._4_4_ = -1;
  local_bd0._vptr_Allocator._0_4_ = -1;
  local_bd8._4_4_ = -1;
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    _allocator = (Allocator *)(local_bd8 + 4);
    _allocator_00 = (Allocator *)local_bd8;
    eval_crop_expr(in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                   (int *)CONCAT17(in_stack_ffffffffffffef0f,in_stack_ffffffffffffef08),
                   in_stack_ffffffffffffef00,
                   (int *)CONCAT17(in_stack_ffffffffffffeeff,in_stack_ffffffffffffeef8),
                   in_stack_ffffffffffffeef0,in_stack_ffffffffffffef30,in_stack_ffffffffffffef38,
                   in_stack_ffffffffffffef40,in_stack_ffffffffffffef48);
  }
  else if (in_RDI->woffset == -0xe9) {
    local_960 = &local_c20;
    local_968 = local_b88;
    if (local_b88->dims == 1) {
      local_46c = local_b88->w * local_b88->elempack;
      local_468 = &local_c20;
      local_478 = 0;
      local_480 = 4;
      local_488 = 0;
      local_c20.elemsize = 4;
      local_c20.elempack = 1;
      local_c20.dims = 1;
      local_c20.h = 1;
      local_c20.d = 1;
      local_c20.c = 1;
      local_c20.cstep = (size_t)local_46c;
      local_c20.w = local_46c;
    }
    else if (local_b88->dims == 2) {
      local_3f4 = local_b88->w;
      local_3f8 = local_b88->h * local_b88->elempack;
      local_3f0 = &local_c20;
      local_400 = 0;
      local_408 = 4;
      local_410 = 0;
      local_c20.elemsize = 4;
      local_c20.elempack = 1;
      local_c20.dims = 2;
      local_c20.d = 1;
      local_c20.c = 1;
      local_c20.cstep = (long)local_3f4 * (long)local_3f8;
      local_c20.w = local_3f4;
      local_c20.h = local_3f8;
    }
    else if (local_b88->dims == 3) {
      local_374 = local_b88->w;
      local_378 = local_b88->h;
      local_37c = local_b88->c * local_b88->elempack;
      local_370 = &local_c20;
      local_388 = 0;
      local_390 = 4;
      local_398 = 0;
      local_c20.elemsize = 4;
      local_c20.elempack = 1;
      local_c20.dims = 3;
      local_c20.d = 1;
      local_220 = (long)local_374 * (long)local_378 * 4;
      local_224 = 0x10;
      local_c20.cstep = (local_220 + 0xfU & 0xfffffffffffffff0) / 4;
      local_c20.w = local_374;
      local_c20.h = local_378;
      local_c20.c = local_37c;
    }
    else if (local_b88->dims == 4) {
      local_2e4 = local_b88->w;
      local_2e8 = local_b88->h;
      local_2ec = local_b88->d;
      local_2f0 = local_b88->c * local_b88->elempack;
      local_2e0 = &local_c20;
      local_2f8 = 0;
      local_300 = 4;
      local_308 = 0;
      local_c20.elemsize = 4;
      local_c20.elempack = 1;
      local_c20.dims = 4;
      local_250 = (long)local_2e4 * (long)local_2e8 * (long)local_2ec * 4;
      local_254 = 0x10;
      local_c20.cstep = (local_250 + 0xfU & 0xfffffffffffffff0) / 4;
      local_c20.w = local_2e4;
      local_c20.h = local_2e8;
      local_c20.d = local_2ec;
      local_c20.c = local_2f0;
    }
    else {
      local_958 = &local_c20;
      local_c20.elemsize = 0;
      local_c20.elempack = 0;
      local_c20.dims = 0;
      local_c20.w = 0;
      local_c20.h = 0;
      local_c20.d = 0;
      local_c20.c = 0;
      local_c20.cstep = 0;
    }
    local_c20.allocator = (Allocator *)0x0;
    local_c20.refcount = (int *)0x0;
    local_c20.data = (void *)0x0;
    local_850 = local_b90;
    in_stack_ffffffffffffed68 = (int *)local_bd8;
    _allocator_00 = (Allocator *)(local_bd8 + 4);
    _allocator = &local_bd0;
    resolve_crop_roi(in_RDI,&local_c20,(int *)local_b90->data,&local_bbc,&local_bc0,&local_bc4,
                     &local_bc8,(int *)((long)&local_bd0._vptr_Allocator + 4),(int *)_allocator,
                     (int *)_allocator_00,in_stack_ffffffffffffed68);
    local_b58 = &local_c20;
    local_5f0 = local_b58;
    if (local_c20.refcount != (int *)0x0) {
      local_5f4 = 0xffffffff;
      LOCK();
      local_5f8 = *local_c20.refcount;
      *local_c20.refcount = *local_c20.refcount + -1;
      UNLOCK();
      if (local_5f8 == 1) {
        if (local_c20.allocator == (Allocator *)0x0) {
          local_5e8 = local_c20.data;
          if (local_c20.data != (void *)0x0) {
            free(local_c20.data);
          }
        }
        else {
          (*(local_c20.allocator)->_vptr_Allocator[3])(local_c20.allocator,local_c20.data);
        }
      }
    }
    local_c20.data = (void *)0x0;
    local_c20.elemsize = 0;
    local_c20.elempack = 0;
    local_c20.dims = 0;
    local_c20.w = 0;
    local_c20.h = 0;
    local_c20.d = 0;
    local_c20.c = 0;
    local_c20.cstep = 0;
    local_c20.refcount = (int *)0x0;
  }
  else {
    local_978 = &local_c78;
    local_980 = local_b88;
    if (local_b88->dims == 1) {
      local_444 = local_b88->w * local_b88->elempack;
      local_440 = &local_c78;
      local_450 = 0;
      local_458 = 4;
      local_460 = 0;
      local_c78.elemsize = 4;
      local_c78.elempack = 1;
      local_c78.dims = 1;
      local_c78.h = 1;
      local_c78.d = 1;
      local_c78.c = 1;
      local_c78.cstep = (size_t)local_444;
      local_c78.w = local_444;
    }
    else if (local_b88->dims == 2) {
      local_3cc = local_b88->w;
      local_3d0 = local_b88->h * local_b88->elempack;
      local_3c8 = &local_c78;
      local_3d8 = 0;
      local_3e0 = 4;
      local_3e8 = 0;
      local_c78.elemsize = 4;
      local_c78.elempack = 1;
      local_c78.dims = 2;
      local_c78.d = 1;
      local_c78.c = 1;
      local_c78.cstep = (long)local_3cc * (long)local_3d0;
      local_c78.w = local_3cc;
      local_c78.h = local_3d0;
    }
    else if (local_b88->dims == 3) {
      local_344 = local_b88->w;
      local_348 = local_b88->h;
      local_34c = local_b88->c * local_b88->elempack;
      local_340 = &local_c78;
      local_358 = 0;
      local_360 = 4;
      local_368 = 0;
      local_c78.elemsize = 4;
      local_c78.elempack = 1;
      local_c78.dims = 3;
      local_c78.d = 1;
      local_230 = (long)local_344 * (long)local_348 * 4;
      local_234 = 0x10;
      local_c78.cstep = (local_230 + 0xfU & 0xfffffffffffffff0) / 4;
      local_c78.w = local_344;
      local_c78.h = local_348;
      local_c78.c = local_34c;
    }
    else if (local_b88->dims == 4) {
      local_2b4 = local_b88->w;
      local_2b8 = local_b88->h;
      local_2bc = local_b88->d;
      local_2c0 = local_b88->c * local_b88->elempack;
      local_2b0 = &local_c78;
      local_2c8 = 0;
      local_2d0 = 4;
      local_2d8 = 0;
      local_c78.elemsize = 4;
      local_c78.elempack = 1;
      local_c78.dims = 4;
      local_260 = (long)local_2b4 * (long)local_2b8 * (long)local_2bc * 4;
      local_264 = 0x10;
      local_c78.cstep = (local_260 + 0xfU & 0xfffffffffffffff0) / 4;
      local_c78.w = local_2b4;
      local_c78.h = local_2b8;
      local_c78.d = local_2bc;
      local_c78.c = local_2c0;
    }
    else {
      local_970 = &local_c78;
      local_c78.elemsize = 0;
      local_c78.elempack = 0;
      local_c78.dims = 0;
      local_c78.w = 0;
      local_c78.h = 0;
      local_c78.d = 0;
      local_c78.c = 0;
      local_c78.cstep = 0;
    }
    local_c78.allocator = (Allocator *)0x0;
    local_c78.refcount = (int *)0x0;
    local_c78.data = (void *)0x0;
    local_990 = &local_cc0;
    local_998 = local_b90;
    if (local_b90->dims == 1) {
      local_41c = local_b90->w * local_b90->elempack;
      local_418 = &local_cc0;
      local_428 = 0;
      local_430 = 4;
      local_438 = 0;
      local_cc0.elemsize = 4;
      local_cc0.elempack = 1;
      local_cc0.dims = 1;
      local_cc0.h = 1;
      local_cc0.d = 1;
      local_cc0.c = 1;
      local_cc0.cstep = (size_t)local_41c;
      local_cc0.w = local_41c;
    }
    else if (local_b90->dims == 2) {
      local_3a4 = local_b90->w;
      local_3a8 = local_b90->h * local_b90->elempack;
      local_3a0 = &local_cc0;
      local_3b0 = 0;
      local_3b8 = 4;
      local_3c0 = 0;
      local_cc0.elemsize = 4;
      local_cc0.elempack = 1;
      local_cc0.dims = 2;
      local_cc0.d = 1;
      local_cc0.c = 1;
      local_cc0.cstep = (long)local_3a4 * (long)local_3a8;
      local_cc0.w = local_3a4;
      local_cc0.h = local_3a8;
    }
    else if (local_b90->dims == 3) {
      local_314 = local_b90->w;
      local_318 = local_b90->h;
      local_31c = local_b90->c * local_b90->elempack;
      local_310 = &local_cc0;
      local_328 = 0;
      local_330 = 4;
      local_338 = 0;
      local_cc0.elemsize = 4;
      local_cc0.elempack = 1;
      local_cc0.dims = 3;
      local_cc0.d = 1;
      local_240 = (long)local_314 * (long)local_318 * 4;
      local_244 = 0x10;
      local_cc0.cstep = (local_240 + 0xfU & 0xfffffffffffffff0) / 4;
      local_cc0.w = local_314;
      local_cc0.h = local_318;
      local_cc0.c = local_31c;
    }
    else if (local_b90->dims == 4) {
      local_284 = local_b90->w;
      local_288 = local_b90->h;
      local_28c = local_b90->d;
      local_290 = local_b90->c * local_b90->elempack;
      local_280 = &local_cc0;
      local_298 = 0;
      local_2a0 = 4;
      local_2a8 = 0;
      local_cc0.elemsize = 4;
      local_cc0.elempack = 1;
      local_cc0.dims = 4;
      local_270 = (long)local_284 * (long)local_288 * (long)local_28c * 4;
      local_274 = 0x10;
      local_cc0.cstep = (local_270 + 0xfU & 0xfffffffffffffff0) / 4;
      local_cc0.w = local_284;
      local_cc0.h = local_288;
      local_cc0.d = local_28c;
      local_cc0.c = local_290;
    }
    else {
      local_988 = &local_cc0;
      local_cc0.elemsize = 0;
      local_cc0.elempack = 0;
      local_cc0.dims = 0;
      local_cc0.w = 0;
      local_cc0.h = 0;
      local_cc0.d = 0;
      local_cc0.c = 0;
      local_cc0.cstep = 0;
    }
    local_cc0.allocator = (Allocator *)0x0;
    local_cc0.refcount = (int *)0x0;
    local_cc0.data = (void *)0x0;
    in_stack_ffffffffffffed68 = (int *)local_bd8;
    _allocator_00 = (Allocator *)(local_bd8 + 4);
    _allocator = &local_bd0;
    resolve_crop_roi(in_RDI,&local_c78,&local_cc0,&local_bbc,&local_bc0,&local_bc4,&local_bc8,
                     (int *)((long)&local_bd0._vptr_Allocator + 4),(int *)_allocator,
                     (int *)_allocator_00,in_stack_ffffffffffffed68);
    local_b48 = &local_cc0;
    local_610 = local_b48;
    if (local_cc0.refcount != (int *)0x0) {
      local_614 = 0xffffffff;
      LOCK();
      local_618 = *local_cc0.refcount;
      *local_cc0.refcount = *local_cc0.refcount + -1;
      UNLOCK();
      if (local_618 == 1) {
        if (local_cc0.allocator == (Allocator *)0x0) {
          local_5d8 = local_cc0.data;
          if (local_cc0.data != (void *)0x0) {
            free(local_cc0.data);
          }
        }
        else {
          (*(local_cc0.allocator)->_vptr_Allocator[3])(local_cc0.allocator,local_cc0.data);
        }
      }
    }
    local_cc0.data = (void *)0x0;
    local_cc0.elemsize = 0;
    local_cc0.elempack = 0;
    local_cc0.dims = 0;
    local_cc0.w = 0;
    local_cc0.h = 0;
    local_cc0.d = 0;
    local_cc0.c = 0;
    local_cc0.cstep = 0;
    local_cc0.refcount = (int *)0x0;
    local_b38 = &local_c78;
    local_630 = local_b38;
    if (local_c78.refcount != (int *)0x0) {
      local_634 = 0xffffffff;
      LOCK();
      local_638 = *local_c78.refcount;
      *local_c78.refcount = *local_c78.refcount + -1;
      UNLOCK();
      if (local_638 == 1) {
        if (local_c78.allocator == (Allocator *)0x0) {
          local_5c8 = local_c78.data;
          if (local_c78.data != (void *)0x0) {
            free(local_c78.data);
          }
        }
        else {
          (*(local_c78.allocator)->_vptr_Allocator[3])(local_c78.allocator,local_c78.data);
        }
      }
    }
    local_c78.data = (void *)0x0;
    local_c78.elemsize = 0;
    local_c78.elempack = 0;
    local_c78.dims = 0;
    local_c78.w = 0;
    local_c78.h = 0;
    local_c78.d = 0;
    local_c78.c = 0;
    local_c78.cstep = 0;
    local_c78.refcount = (int *)0x0;
  }
  pvVar7 = local_bb8;
  if (local_ba4 == 1) {
    if (local_bd0._vptr_Allocator._4_4_ == local_b94) {
      local_9d8 = local_bb8;
      local_9e0 = local_b88;
      if (local_bb8 != local_b88) {
        if (local_b88->refcount != (int *)0x0) {
          piVar1 = local_b88->refcount;
          local_9e4 = 1;
          LOCK();
          local_9e8 = *piVar1;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_7e0 = local_bb8;
        if (local_bb8->refcount != (int *)0x0) {
          piVar1 = local_bb8->refcount;
          local_7e4 = 0xffffffff;
          LOCK();
          local_7e8 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_7e8 == 1) {
            if (local_bb8->allocator == (Allocator *)0x0) {
              local_4f0 = local_bb8->data;
              if (local_4f0 != (void *)0x0) {
                free(local_4f0);
              }
            }
            else {
              (*local_bb8->allocator->_vptr_Allocator[3])(local_bb8->allocator,local_bb8->data);
            }
          }
        }
        pvVar7->data = (void *)0x0;
        pvVar7->elemsize = 0;
        pvVar7->elempack = 0;
        pvVar7->dims = 0;
        pvVar7->w = 0;
        pvVar7->h = 0;
        pvVar7->d = 0;
        pvVar7->c = 0;
        pvVar7->cstep = 0;
        pvVar7->refcount = (int *)0x0;
        pvVar7->data = local_9e0->data;
        pvVar7->refcount = local_9e0->refcount;
        pvVar7->elemsize = local_9e0->elemsize;
        pvVar7->elempack = local_9e0->elempack;
        pvVar7->allocator = local_9e0->allocator;
        pvVar7->dims = local_9e0->dims;
        pvVar7->w = local_9e0->w;
        pvVar7->h = local_9e0->h;
        pvVar7->d = local_9e0->d;
        pvVar7->c = local_9e0->c;
        pvVar7->cstep = local_9e0->cstep;
      }
      return 0;
    }
    Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                (int)((ulong)in_stack_ffffffffffffed68 >> 0x20),(size_t)_allocator_00,_allocator);
    local_9a0 = local_bb8;
    bVar3 = true;
    if (local_bb8->data != (void *)0x0) {
      local_4b8 = local_bb8;
      bVar3 = local_bb8->cstep * (long)local_bb8->c == 0;
    }
    if (bVar3) {
      return -100;
    }
    if (local_bb0 == 1) {
      copy_cut_border_image<signed_char>
                (in_stack_ffffffffffffed78,
                 (Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                 (int)((ulong)in_stack_ffffffffffffed68 >> 0x20),(int)in_stack_ffffffffffffed68);
    }
    if (local_bb0 == 2) {
      copy_cut_border_image<unsigned_short>
                (in_stack_ffffffffffffed78,
                 (Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                 (int)((ulong)in_stack_ffffffffffffed68 >> 0x20),(int)in_stack_ffffffffffffed68);
    }
    if (local_bb0 == 4) {
      copy_cut_border_image<float>
                (in_stack_ffffffffffffed78,
                 (Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                 (int)((ulong)in_stack_ffffffffffffed68 >> 0x20),(int)in_stack_ffffffffffffed68);
    }
  }
  pvVar7 = local_bb8;
  if (local_ba4 == 2) {
    if ((local_bd0._vptr_Allocator._4_4_ == local_b94) &&
       ((int)local_bd0._vptr_Allocator == local_b98)) {
      local_9f8 = local_bb8;
      local_a00 = local_b88;
      if (local_bb8 != local_b88) {
        if (local_b88->refcount != (int *)0x0) {
          piVar1 = local_b88->refcount;
          local_a04 = 1;
          LOCK();
          local_a08 = *piVar1;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_7d0 = local_bb8;
        if (local_bb8->refcount != (int *)0x0) {
          piVar1 = local_bb8->refcount;
          local_7d4 = 0xffffffff;
          LOCK();
          local_7d8 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_7d8 == 1) {
            if (local_bb8->allocator == (Allocator *)0x0) {
              local_4f8 = local_bb8->data;
              if (local_4f8 != (void *)0x0) {
                free(local_4f8);
              }
            }
            else {
              (*local_bb8->allocator->_vptr_Allocator[3])(local_bb8->allocator,local_bb8->data);
            }
          }
        }
        pvVar7->data = (void *)0x0;
        pvVar7->elemsize = 0;
        pvVar7->elempack = 0;
        pvVar7->dims = 0;
        pvVar7->w = 0;
        pvVar7->h = 0;
        pvVar7->d = 0;
        pvVar7->c = 0;
        pvVar7->cstep = 0;
        pvVar7->refcount = (int *)0x0;
        pvVar7->data = local_a00->data;
        pvVar7->refcount = local_a00->refcount;
        pvVar7->elemsize = local_a00->elemsize;
        pvVar7->elempack = local_a00->elempack;
        pvVar7->allocator = local_a00->allocator;
        pvVar7->dims = local_a00->dims;
        pvVar7->w = local_a00->w;
        pvVar7->h = local_a00->h;
        pvVar7->d = local_a00->d;
        pvVar7->c = local_a00->c;
        pvVar7->cstep = local_a00->cstep;
      }
      return 0;
    }
    Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                (int)((ulong)in_stack_ffffffffffffed68 >> 0x20),(int)in_stack_ffffffffffffed68,
                (size_t)_allocator_00,_allocator);
    local_9a8 = local_bb8;
    bVar3 = true;
    if (local_bb8->data != (void *)0x0) {
      local_4b0 = local_bb8;
      bVar3 = local_bb8->cstep * (long)local_bb8->c == 0;
    }
    if (bVar3) {
      return -100;
    }
    if (local_bb0 == 1) {
      copy_cut_border_image<signed_char>
                (in_stack_ffffffffffffed78,
                 (Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                 (int)((ulong)in_stack_ffffffffffffed68 >> 0x20),(int)in_stack_ffffffffffffed68);
    }
    if (local_bb0 == 2) {
      copy_cut_border_image<unsigned_short>
                (in_stack_ffffffffffffed78,
                 (Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                 (int)((ulong)in_stack_ffffffffffffed68 >> 0x20),(int)in_stack_ffffffffffffed68);
    }
    if (local_bb0 == 4) {
      copy_cut_border_image<float>
                (in_stack_ffffffffffffed78,
                 (Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                 (int)((ulong)in_stack_ffffffffffffed68 >> 0x20),(int)in_stack_ffffffffffffed68);
    }
  }
  if (local_ba4 == 3) {
    if (((local_bd0._vptr_Allocator._4_4_ == local_b94) &&
        ((int)local_bd0._vptr_Allocator == local_b98)) && (local_bd8._0_4_ == local_ba0)) {
      local_a18 = local_bb8;
      local_a20 = local_b88;
      if (local_bb8 != local_b88) {
        if (local_b88->refcount != (int *)0x0) {
          piVar1 = local_b88->refcount;
          local_a24 = 1;
          LOCK();
          local_a28 = *piVar1;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_7c0 = local_bb8;
        pvVar7 = local_bb8;
        if (local_bb8->refcount != (int *)0x0) {
          piVar1 = local_bb8->refcount;
          local_7c4 = 0xffffffff;
          LOCK();
          local_7c8 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_7c8 == 1) {
            if (local_bb8->allocator == (Allocator *)0x0) {
              local_500 = local_bb8->data;
              if (local_500 != (void *)0x0) {
                free(local_500);
              }
            }
            else {
              (*local_bb8->allocator->_vptr_Allocator[3])(local_bb8->allocator,local_bb8->data);
            }
          }
        }
        local_bb8->data = (void *)0x0;
        local_bb8->elemsize = 0;
        local_bb8->elempack = 0;
        local_bb8->dims = 0;
        local_bb8->w = 0;
        local_bb8->h = 0;
        local_bb8->d = 0;
        local_bb8->c = 0;
        local_bb8->cstep = 0;
        local_bb8->refcount = (int *)0x0;
        pvVar7->data = local_a20->data;
        pvVar7->refcount = local_a20->refcount;
        pvVar7->elemsize = local_a20->elemsize;
        pvVar7->elempack = local_a20->elempack;
        pvVar7->allocator = local_a20->allocator;
        pvVar7->dims = local_a20->dims;
        pvVar7->w = local_a20->w;
        pvVar7->h = local_a20->h;
        pvVar7->d = local_a20->d;
        pvVar7->c = local_a20->c;
        pvVar7->cstep = local_a20->cstep;
      }
      return 0;
    }
    local_910 = &local_d08;
    local_1ec = local_b88->w;
    local_1f0 = local_b88->h;
    local_1f4 = local_b88->d;
    local_200 = (void *)((long)local_b88->data +
                        local_b88->cstep * (long)local_bc8 * local_b88->elemsize);
    local_208 = local_b88->elemsize;
    local_20c = local_b88->elempack;
    local_218 = local_b88->allocator;
    local_1e8 = &local_d08;
    local_d00 = (int *)0x0;
    local_cd0 = local_bd8._0_4_;
    local_1d8 = (long)local_1ec * (long)local_1f0 * (long)(int)local_1f4 * local_208;
    local_cc8 = (local_1d8 + 0xfU & 0xfffffffffffffff0) / local_208;
    local_ce0 = local_b88->dims;
    local_1dc = 0x10;
    local_918 = local_b88;
    local_91c = local_bc8;
    local_921 = 1;
    local_d08 = local_200;
    local_cf8 = local_208;
    local_cf0 = local_20c;
    local_ce8 = local_218;
    local_cdc = local_1ec;
    local_cd8 = local_1f0;
    local_cd4 = local_1f4;
    if ((local_bd0._vptr_Allocator._4_4_ == local_b94) &&
       ((int)local_bd0._vptr_Allocator == local_b98)) {
      Mat::clone(&local_d50,(__fn *)&local_d08,*(void **)(local_b80 + 8),(int)local_1e8,
                 (void *)(ulong)local_1f4);
      pvVar7 = local_bb8;
      local_a38 = local_bb8;
      local_a40 = &local_d50;
      if (local_bb8 != local_a40) {
        if (local_d50.refcount != (int *)0x0) {
          local_a44 = 1;
          LOCK();
          local_a48 = *local_d50.refcount;
          *local_d50.refcount = *local_d50.refcount + 1;
          UNLOCK();
        }
        local_7b0 = local_bb8;
        pvVar6 = local_bb8;
        if (local_bb8->refcount != (int *)0x0) {
          piVar1 = local_bb8->refcount;
          local_7b4 = 0xffffffff;
          LOCK();
          local_7b8 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_7b8 == 1) {
            if (local_bb8->allocator == (Allocator *)0x0) {
              local_508 = local_bb8->data;
              if (local_508 != (void *)0x0) {
                free(local_508);
              }
            }
            else {
              (*local_bb8->allocator->_vptr_Allocator[3])(local_bb8->allocator,local_bb8->data);
            }
          }
        }
        pvVar6->data = (void *)0x0;
        pvVar6->elemsize = 0;
        pvVar6->elempack = 0;
        pvVar6->dims = 0;
        pvVar6->w = 0;
        pvVar6->h = 0;
        pvVar6->d = 0;
        pvVar6->c = 0;
        pvVar6->cstep = 0;
        pvVar6->refcount = (int *)0x0;
        pvVar7->data = local_a40->data;
        pvVar7->refcount = local_a40->refcount;
        pvVar7->elemsize = local_a40->elemsize;
        pvVar7->elempack = local_a40->elempack;
        pvVar7->allocator = local_a40->allocator;
        pvVar7->dims = local_a40->dims;
        pvVar7->w = local_a40->w;
        pvVar7->h = local_a40->h;
        pvVar7->d = local_a40->d;
        pvVar7->c = local_a40->c;
        pvVar7->cstep = local_a40->cstep;
      }
      local_a30 = pvVar7;
      pMVar5 = &local_d50;
      local_b28 = pMVar5;
      local_650 = pMVar5;
      if (local_d50.refcount != (int *)0x0) {
        local_654 = 0xffffffff;
        LOCK();
        local_658 = *local_d50.refcount;
        *local_d50.refcount = *local_d50.refcount + -1;
        UNLOCK();
        if (local_658 == 1) {
          if (local_d50.allocator == (Allocator *)0x0) {
            if (local_d50.data != (void *)0x0) {
              free(local_d50.data);
            }
          }
          else {
            (*(local_d50.allocator)->_vptr_Allocator[3])(local_d50.allocator,local_d50.data);
          }
        }
      }
      pMVar5->data = (void *)0x0;
      pMVar5->elemsize = 0;
      pMVar5->elempack = 0;
      pMVar5->dims = 0;
      pMVar5->w = 0;
      pMVar5->h = 0;
      pMVar5->d = 0;
      pMVar5->c = 0;
      pMVar5->cstep = 0;
      pMVar5->refcount = (int *)0x0;
      local_9b0 = local_bb8;
      bVar3 = true;
      if (local_bb8->data != (void *)0x0) {
        local_4a8 = local_bb8;
        bVar3 = local_bb8->cstep * (long)local_bb8->c == 0;
      }
      if (bVar3) {
        local_b5c = -100;
        local_d54 = 1;
      }
      else {
        local_b5c = 0;
        local_d54 = 1;
      }
    }
    else {
      Mat::create(in_stack_ffffffffffffed80,(int)((ulong)in_stack_ffffffffffffed78 >> 0x20),
                  (int)in_stack_ffffffffffffed78,in_stack_ffffffffffffed74,
                  (size_t)in_stack_ffffffffffffed68,_allocator_00);
      local_9b8 = local_bb8;
      bVar3 = true;
      if (local_bb8->data != (void *)0x0) {
        local_4a0 = local_bb8;
        bVar3 = local_bb8->cstep * (long)local_bb8->c == 0;
      }
      if (bVar3) {
        local_b5c = -100;
        local_d54 = 1;
      }
      else {
        for (local_d58 = 0; local_d58 < (int)local_bd8._0_4_; local_d58 = local_d58 + 1) {
          local_8d0 = &local_da0;
          local_8d8 = &local_d08;
          local_e0 = (void *)((long)local_d08 + local_cc8 * (long)local_d58 * local_cf8);
          local_c8 = &local_da0;
          local_d98 = (int *)0x0;
          local_d90 = local_cf8;
          local_d88 = local_cf0;
          local_d80 = local_ce8;
          local_d74 = local_cdc;
          local_d70 = local_cd8;
          local_d6c = 1;
          local_d68 = local_cd4;
          local_b8 = (long)local_cdc * (long)local_cd8 * local_cf8;
          local_d60 = (local_b8 + 0xfU & 0xfffffffffffffff0) / local_cf8;
          local_d78 = local_ce0 + -1;
          if (local_ce0 == 4) {
            local_d60 = (long)local_cdc * (long)local_cd8;
          }
          local_890 = &local_de8;
          local_15c = local_bb8->w;
          local_160 = local_bb8->h;
          local_164 = local_bb8->d;
          local_170 = (void *)((long)local_bb8->data +
                              local_bb8->cstep * (long)local_d58 * local_bb8->elemsize);
          local_178 = local_bb8->elemsize;
          local_17c = local_bb8->elempack;
          local_188 = local_bb8->allocator;
          local_158 = &local_de8;
          local_de0 = (int *)0x0;
          local_db4 = 1;
          local_148 = (long)local_15c * (long)local_160 * local_178;
          local_da8 = (local_148 + 0xfU & 0xfffffffffffffff0) / local_178;
          local_dc0 = local_bb8->dims + -1;
          if (local_bb8->dims == 4) {
            local_da8 = (long)local_bb8->w * (long)local_bb8->h;
          }
          local_bc = 0x10;
          local_cc = local_cdc;
          local_d0 = local_cd8;
          local_d4 = local_cd4;
          local_e8 = local_cf8;
          local_ec = local_cf0;
          local_f8 = local_ce8;
          local_14c = 0x10;
          local_898 = local_bb8;
          local_89c = local_d58;
          local_89d = 1;
          local_8dc = local_d58;
          local_8dd = 1;
          local_de8 = local_170;
          local_dd8 = local_178;
          local_dd0 = local_17c;
          local_dc8 = local_188;
          local_dbc = local_15c;
          local_db8 = local_160;
          local_db0 = local_164;
          local_da0 = local_e0;
          if (local_bb0 == 1) {
            copy_cut_border_image<signed_char>
                      (in_stack_ffffffffffffed78,
                       (Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                       (int)((ulong)in_stack_ffffffffffffed68 >> 0x20),
                       (int)in_stack_ffffffffffffed68);
          }
          if (local_bb0 == 2) {
            copy_cut_border_image<unsigned_short>
                      (in_stack_ffffffffffffed78,
                       (Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                       (int)((ulong)in_stack_ffffffffffffed68 >> 0x20),
                       (int)in_stack_ffffffffffffed68);
          }
          if (local_bb0 == 4) {
            copy_cut_border_image<float>
                      (in_stack_ffffffffffffed78,
                       (Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                       (int)((ulong)in_stack_ffffffffffffed68 >> 0x20),
                       (int)in_stack_ffffffffffffed68);
          }
          local_b18 = &local_de8;
          local_670 = local_b18;
          if (local_de0 != (int *)0x0) {
            local_674 = 0xffffffff;
            LOCK();
            local_678 = *local_de0;
            *local_de0 = *local_de0 + -1;
            UNLOCK();
            if (local_678 == 1) {
              if (local_dc8 == (Allocator *)0x0) {
                local_5a8 = local_de8;
                if (local_de8 != (void *)0x0) {
                  free(local_de8);
                }
              }
              else {
                (*local_dc8->_vptr_Allocator[3])(local_dc8,local_de8);
              }
            }
          }
          local_de8 = (void *)0x0;
          local_dd8 = 0;
          local_dd0 = 0;
          local_dc0 = 0;
          local_dbc = 0;
          local_db8 = 0;
          local_db4 = 0;
          local_db0 = 0;
          local_da8 = 0;
          local_de0 = (int *)0x0;
          local_b08 = &local_da0;
          local_690 = local_b08;
          if (local_d98 != (int *)0x0) {
            local_694 = 0xffffffff;
            LOCK();
            local_698 = *local_d98;
            *local_d98 = *local_d98 + -1;
            UNLOCK();
            if (local_698 == 1) {
              if (local_d80 == (Allocator *)0x0) {
                local_598 = local_da0;
                if (local_da0 != (void *)0x0) {
                  free(local_da0);
                }
              }
              else {
                (*local_d80->_vptr_Allocator[3])(local_d80,local_da0);
              }
            }
          }
          local_da0 = (void *)0x0;
          local_d90 = 0;
          local_d88 = 0;
          local_d78 = 0;
          local_d74 = 0;
          local_d70 = 0;
          local_d6c = 0;
          local_d68 = 0;
          local_d60 = 0;
          local_d98 = (int *)0x0;
        }
        local_d54 = 0;
      }
    }
    local_af8 = &local_d08;
    local_6b0 = local_af8;
    if (local_d00 != (int *)0x0) {
      local_6b4 = 0xffffffff;
      LOCK();
      local_6b8 = *local_d00;
      *local_d00 = *local_d00 + -1;
      UNLOCK();
      if (local_6b8 == 1) {
        if (local_ce8 == (Allocator *)0x0) {
          local_588 = local_d08;
          if (local_d08 != (void *)0x0) {
            free(local_d08);
          }
        }
        else {
          (*local_ce8->_vptr_Allocator[3])(local_ce8,local_d08);
        }
      }
    }
    local_d08 = (void *)0x0;
    local_cf8 = 0;
    local_cf0 = 0;
    local_ce0 = 0;
    local_cdc = 0;
    local_cd8 = 0;
    local_cd4 = 0;
    local_cd0 = 0;
    local_cc8 = 0;
    local_d00 = (int *)0x0;
    if (local_d54 != 0) {
      return local_b5c;
    }
  }
  pvVar7 = local_bb8;
  if (local_ba4 == 4) {
    if (((local_bd0._vptr_Allocator._4_4_ == local_b94) &&
        ((int)local_bd0._vptr_Allocator == local_b98)) &&
       ((local_bd8._4_4_ == local_b9c && (local_bd8._0_4_ == local_ba0)))) {
      local_a58 = local_bb8;
      local_a60 = local_b88;
      if (local_bb8 != local_b88) {
        if (local_b88->refcount != (int *)0x0) {
          piVar1 = local_b88->refcount;
          local_a64 = 1;
          LOCK();
          local_a68 = *piVar1;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_7a0 = local_bb8;
        if (local_bb8->refcount != (int *)0x0) {
          piVar1 = local_bb8->refcount;
          local_7a4 = 0xffffffff;
          LOCK();
          local_7a8 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_7a8 == 1) {
            if (local_bb8->allocator == (Allocator *)0x0) {
              local_510 = local_bb8->data;
              if (local_510 != (void *)0x0) {
                free(local_510);
              }
            }
            else {
              (*local_bb8->allocator->_vptr_Allocator[3])(local_bb8->allocator,local_bb8->data);
            }
          }
        }
        pvVar7->data = (void *)0x0;
        pvVar7->elemsize = 0;
        pvVar7->elempack = 0;
        pvVar7->dims = 0;
        pvVar7->w = 0;
        pvVar7->h = 0;
        pvVar7->d = 0;
        pvVar7->c = 0;
        pvVar7->cstep = 0;
        pvVar7->refcount = (int *)0x0;
        pvVar7->data = local_a60->data;
        pvVar7->refcount = local_a60->refcount;
        pvVar7->elemsize = local_a60->elemsize;
        pvVar7->elempack = local_a60->elempack;
        pvVar7->allocator = local_a60->allocator;
        pvVar7->dims = local_a60->dims;
        pvVar7->w = local_a60->w;
        pvVar7->h = local_a60->h;
        pvVar7->d = local_a60->d;
        pvVar7->c = local_a60->c;
        pvVar7->cstep = local_a60->cstep;
      }
      return 0;
    }
    local_938 = &local_e30;
    local_1a4 = local_b88->w;
    local_1a8 = local_b88->h;
    local_1ac = local_b88->d;
    local_1b8 = (void *)((long)local_b88->data +
                        local_b88->cstep * (long)local_bc8 * local_b88->elemsize);
    local_1c0 = local_b88->elemsize;
    local_1c4 = local_b88->elempack;
    local_1d0 = local_b88->allocator;
    local_1a0 = &local_e30;
    local_e28 = (int *)0x0;
    local_df8 = local_bd8._0_4_;
    local_190 = (long)local_1a4 * (long)local_1a8 * (long)(int)local_1ac * local_1c0;
    local_df0 = (local_190 + 0xfU & 0xfffffffffffffff0) / local_1c0;
    local_e08 = local_b88->dims;
    local_194 = 0x10;
    local_940 = local_b88;
    local_944 = local_bc8;
    local_949 = 1;
    local_e30 = local_1b8;
    local_e20 = local_1c0;
    local_e18 = local_1c4;
    local_e10 = local_1d0;
    local_e04 = local_1a4;
    local_e00 = local_1a8;
    local_dfc = local_1ac;
    if (((local_bd0._vptr_Allocator._4_4_ == local_b94) &&
        ((int)local_bd0._vptr_Allocator == local_b98)) && (local_bd8._4_4_ == local_b9c)) {
      Mat::clone(&local_e78,(__fn *)&local_e30,*(void **)(local_b80 + 8),(int)local_1a0,
                 (void *)(ulong)local_1ac);
      pvVar7 = local_bb8;
      local_a78 = local_bb8;
      local_a80 = &local_e78;
      if (local_bb8 != local_a80) {
        if (local_e78.refcount != (int *)0x0) {
          local_a84 = 1;
          LOCK();
          local_a88 = *local_e78.refcount;
          *local_e78.refcount = *local_e78.refcount + 1;
          UNLOCK();
        }
        local_790 = local_bb8;
        if (local_bb8->refcount != (int *)0x0) {
          piVar1 = local_bb8->refcount;
          local_794 = 0xffffffff;
          LOCK();
          local_798 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_798 == 1) {
            if (local_bb8->allocator == (Allocator *)0x0) {
              local_518 = local_bb8->data;
              if (local_518 != (void *)0x0) {
                free(local_518);
              }
            }
            else {
              (*local_bb8->allocator->_vptr_Allocator[3])(local_bb8->allocator,local_bb8->data);
            }
          }
        }
        pvVar7->data = (void *)0x0;
        pvVar7->elemsize = 0;
        pvVar7->elempack = 0;
        pvVar7->dims = 0;
        pvVar7->w = 0;
        pvVar7->h = 0;
        pvVar7->d = 0;
        pvVar7->c = 0;
        pvVar7->cstep = 0;
        pvVar7->refcount = (int *)0x0;
        pvVar7->data = local_a80->data;
        pvVar7->refcount = local_a80->refcount;
        pvVar7->elemsize = local_a80->elemsize;
        pvVar7->elempack = local_a80->elempack;
        pvVar7->allocator = local_a80->allocator;
        pvVar7->dims = local_a80->dims;
        pvVar7->w = local_a80->w;
        pvVar7->h = local_a80->h;
        pvVar7->d = local_a80->d;
        pvVar7->c = local_a80->c;
        pvVar7->cstep = local_a80->cstep;
      }
      local_a70 = pvVar7;
      local_ae8 = &local_e78;
      local_6d0 = local_ae8;
      if (local_e78.refcount != (int *)0x0) {
        local_6d4 = 0xffffffff;
        LOCK();
        local_6d8 = *local_e78.refcount;
        *local_e78.refcount = *local_e78.refcount + -1;
        UNLOCK();
        if (local_6d8 == 1) {
          if (local_e78.allocator == (Allocator *)0x0) {
            if (local_e78.data != (void *)0x0) {
              free(local_e78.data);
            }
          }
          else {
            (*(local_e78.allocator)->_vptr_Allocator[3])(local_e78.allocator,local_e78.data);
          }
        }
      }
      local_e78.data = (void *)0x0;
      local_e78.elemsize = 0;
      local_e78.elempack = 0;
      local_e78.dims = 0;
      local_e78.w = 0;
      local_e78.h = 0;
      local_e78.d = 0;
      local_e78.c = 0;
      local_e78.cstep = 0;
      local_e78.refcount = (int *)0x0;
      local_9c0 = local_bb8;
      bVar3 = true;
      if (local_bb8->data != (void *)0x0) {
        local_498 = local_bb8;
        bVar3 = local_bb8->cstep * (long)local_bb8->c == 0;
      }
      if (bVar3) {
        local_b5c = -100;
        local_d54 = 1;
      }
      else {
        local_b5c = 0;
        local_d54 = 1;
      }
    }
    else {
      Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                  (int)((ulong)in_stack_ffffffffffffed68 >> 0x20),(int)in_stack_ffffffffffffed68,
                  (int)((ulong)_allocator_00 >> 0x20),(int)_allocator_00,(size_t)_allocator,
                  in_stack_ffffffffffffedd0);
      local_9c8 = local_bb8;
      bVar3 = true;
      if (local_bb8->data != (void *)0x0) {
        local_490 = local_bb8;
        bVar3 = local_bb8->cstep * (long)local_bb8->c == 0;
      }
      if (bVar3) {
        local_b5c = -100;
        local_d54 = 1;
      }
      else {
        for (local_e7c = 0; local_e7c < (int)local_bd8._0_4_; local_e7c = local_e7c + 1) {
          for (local_e80 = 0; local_e80 < (int)local_bd8._4_4_; local_e80 = local_e80 + 1) {
            local_8f0 = &local_f10;
            local_8f8 = &local_e30;
            local_98 = (void *)((long)local_e30 + local_df0 * (long)local_e7c * local_e20);
            local_80 = &local_f10;
            local_70 = (long)local_e04 * (long)local_e00 * local_e20;
            local_87c = local_e80 + local_bc4;
            local_870 = &local_ec8;
            local_878 = &local_f10;
            local_20 = (void *)((long)local_98 +
                               (long)local_e04 * (long)local_e00 * (long)local_87c * local_e20);
            local_10 = &local_ec8;
            local_e88 = (long)local_e04 * (long)local_e00;
            local_ad8 = &local_f10;
            local_e90 = 1;
            local_e94 = 1;
            local_e98 = local_e00;
            local_e9c = local_e04;
            local_ea0 = 2;
            local_ea8 = local_e10;
            local_eb0 = local_e18;
            local_eb8 = local_e20;
            local_ec0 = (int *)0x0;
            local_ef0 = local_e10;
            local_14 = local_e04;
            local_18 = local_e00;
            local_28 = local_e20;
            local_2c = local_e18;
            local_38 = local_e10;
            local_74 = 0x10;
            local_84 = local_e04;
            local_88 = local_e00;
            local_8c = local_dfc;
            local_a0 = local_e20;
            local_a4 = local_e18;
            local_b0 = local_e10;
            local_8fc = local_e7c;
            local_8fd = 1;
            local_f10 = 0;
            local_f00 = 0;
            local_ef8 = 0;
            local_ee8 = 0;
            local_ee4 = 0;
            local_ee0 = 0;
            local_edc = 0;
            local_ed8 = 0;
            local_ed0 = 0;
            local_f08 = 0;
            local_8b0 = &local_fa0;
            local_114 = local_bb8->w;
            local_118 = local_bb8->h;
            local_11c = local_bb8->d;
            local_128 = (void *)((long)local_bb8->data +
                                local_bb8->cstep * (long)local_e7c * local_bb8->elemsize);
            local_130 = local_bb8->elemsize;
            local_134 = local_bb8->elempack;
            local_140 = local_bb8->allocator;
            local_110 = &local_fa0;
            local_100 = (long)local_114 * (long)local_118 * local_130;
            local_858 = &local_f58;
            local_860 = &local_fa0;
            local_50 = (void *)((long)local_128 +
                               (long)local_114 * (long)local_118 * (long)local_e80 * local_130);
            local_40 = &local_f58;
            local_f18 = (long)local_114 * (long)local_118;
            local_ac8 = &local_fa0;
            local_f20 = 1;
            local_f24 = 1;
            local_f30 = 2;
            local_f50 = (int *)0x0;
            local_104 = 0x10;
            local_864 = local_e80;
            local_8b8 = local_bb8;
            local_8bc = local_e7c;
            local_8bd = 1;
            local_fa0 = 0;
            local_f90 = 0;
            local_f88 = 0;
            local_f78 = 0;
            local_f74 = 0;
            local_f70 = 0;
            local_f6c = 0;
            local_f68 = 0;
            local_f60 = 0;
            local_f98 = 0;
            local_710 = local_ac8;
            local_6f0 = local_ad8;
            local_68 = local_140;
            local_5c = local_134;
            local_58 = local_130;
            local_48 = local_118;
            local_44 = local_114;
            local_f80 = local_140;
            local_f58 = local_50;
            local_f48 = local_130;
            local_f40 = local_134;
            local_f38 = local_140;
            local_f2c = local_114;
            local_f28 = local_118;
            local_ec8 = local_20;
            if (local_bb0 == 1) {
              copy_cut_border_image<signed_char>
                        (in_stack_ffffffffffffed78,
                         (Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                         (int)((ulong)in_stack_ffffffffffffed68 >> 0x20),
                         (int)in_stack_ffffffffffffed68);
            }
            if (local_bb0 == 2) {
              copy_cut_border_image<unsigned_short>
                        (in_stack_ffffffffffffed78,
                         (Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                         (int)((ulong)in_stack_ffffffffffffed68 >> 0x20),
                         (int)in_stack_ffffffffffffed68);
            }
            if (local_bb0 == 4) {
              copy_cut_border_image<float>
                        (in_stack_ffffffffffffed78,
                         (Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                         (int)((ulong)in_stack_ffffffffffffed68 >> 0x20),
                         (int)in_stack_ffffffffffffed68);
            }
            local_ab8 = &local_f58;
            local_730 = local_ab8;
            if (local_f50 != (int *)0x0) {
              local_734 = 0xffffffff;
              LOCK();
              local_738 = *local_f50;
              *local_f50 = *local_f50 + -1;
              UNLOCK();
              if (local_738 == 1) {
                if (local_f38 == (Allocator *)0x0) {
                  local_548 = local_f58;
                  if (local_f58 != (void *)0x0) {
                    free(local_f58);
                  }
                }
                else {
                  (*local_f38->_vptr_Allocator[3])(local_f38,local_f58);
                }
              }
            }
            local_f58 = (void *)0x0;
            local_f48 = 0;
            local_f40 = 0;
            local_f30 = 0;
            local_f2c = 0;
            local_f28 = 0;
            local_f24 = 0;
            local_f20 = 0;
            local_f18 = 0;
            local_f50 = (int *)0x0;
            local_aa8 = &local_ec8;
            local_750 = local_aa8;
            if (local_ec0 != (int *)0x0) {
              local_754 = 0xffffffff;
              LOCK();
              local_758 = *local_ec0;
              *local_ec0 = *local_ec0 + -1;
              UNLOCK();
              if (local_758 == 1) {
                if (local_ea8 == (Allocator *)0x0) {
                  local_538 = local_ec8;
                  if (local_ec8 != (void *)0x0) {
                    free(local_ec8);
                  }
                }
                else {
                  (*local_ea8->_vptr_Allocator[3])(local_ea8,local_ec8);
                }
              }
            }
            local_ec8 = (void *)0x0;
            local_eb8 = 0;
            local_eb0 = 0;
            local_ea0 = 0;
            local_e9c = 0;
            local_e98 = 0;
            local_e94 = 0;
            local_e90 = 0;
            local_e88 = 0;
            local_ec0 = (int *)0x0;
          }
        }
        local_d54 = 0;
      }
    }
    ppvVar4 = &local_e30;
    if (local_e28 != (int *)0x0) {
      local_774 = 0xffffffff;
      LOCK();
      local_778 = *local_e28;
      *local_e28 = *local_e28 + -1;
      UNLOCK();
      if (local_778 == 1) {
        local_a98 = ppvVar4;
        local_770 = ppvVar4;
        if (local_e10 == (Allocator *)0x0) {
          local_528 = local_e30;
          if (local_e30 != (void *)0x0) {
            free(local_e30);
          }
        }
        else {
          (*local_e10->_vptr_Allocator[3])(local_e10,local_e30);
        }
      }
    }
    *ppvVar4 = (void *)0x0;
    ppvVar4[2] = (void *)0x0;
    *(undefined4 *)(ppvVar4 + 3) = 0;
    *(undefined4 *)(ppvVar4 + 5) = 0;
    *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
    *(undefined4 *)(ppvVar4 + 6) = 0;
    *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
    *(undefined4 *)(ppvVar4 + 7) = 0;
    ppvVar4[8] = (void *)0x0;
    ppvVar4[1] = (void *)0x0;
    if (local_d54 != 0) {
      return local_b5c;
    }
  }
  return 0;
}

Assistant:

int Crop::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    Mat& top_blob = top_blobs[0];

    int _woffset, _hoffset, _doffset, _coffset = -1;
    int _outw = -1, _outh = -1, _outd = -1, _outc;

    if (!starts_expr.empty() && !ends_expr.empty())
    {
        eval_crop_expr(bottom_blobs, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else if (woffset == -233)
    {
        resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }
    }

    if (dims == 4)
    {
        if (_outw == w && _outh == h && _outd == d && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h && _outd == d)
        {
            top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outd, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            for (int z = 0; z < _outd; z++)
            {
                const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                Mat borderm = top_blob.channel(q).depth(z);

                if (elemsize == 1)
                    copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
                if (elemsize == 2)
                    copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
                if (elemsize == 4)
                    copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
            }
        }
    }

    return 0;
}